

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ATN.hpp
# Opt level: O3

void __thiscall Centaurus::ATNNode<unsigned_char>::~ATNNode(ATNNode<unsigned_char> *this)

{
  pointer puVar1;
  pointer pwVar2;
  
  this->_vptr_ATNNode = (_func_int **)&PTR__ATNNode_0019e728;
  puVar1 = (this->m_literal)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>_11
       *)puVar1 != &(this->m_literal).field_2) {
    operator_delete(puVar1);
  }
  (this->m_nfa).super_NFABase<Centaurus::NFABaseState<unsigned_char,_int>_>._vptr_NFABase =
       (_func_int **)&PTR__NFABase_0019e7b0;
  std::
  vector<Centaurus::NFABaseState<unsigned_char,_int>,_std::allocator<Centaurus::NFABaseState<unsigned_char,_int>_>_>
  ::~vector(&(this->m_nfa).super_NFABase<Centaurus::NFABaseState<unsigned_char,_int>_>.m_states);
  (this->m_invoke)._vptr_Identifier = (_func_int **)&PTR__Identifier_0019cd38;
  pwVar2 = (this->m_invoke).m_id._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)pwVar2 != &(this->m_invoke).m_id.field_2) {
    operator_delete(pwVar2);
  }
  std::
  vector<Centaurus::ATNTransition<unsigned_char>,_std::allocator<Centaurus::ATNTransition<unsigned_char>_>_>
  ::~vector(&this->m_transitions);
  return;
}

Assistant:

virtual ~ATNNode()
    {
    }